

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_statements.cpp
# Opt level: O0

PropertySpecSyntax * __thiscall slang::parsing::Parser::parsePropertySpec(Parser *this)

{
  Token iff_00;
  Token disable_00;
  Token openParen_00;
  Token closeParen;
  bool bVar1;
  ParserBase *this_00;
  Info *pIVar2;
  PropertySpecSyntax *pPVar3;
  long in_RDI;
  Token TVar4;
  int in_stack_0000002c;
  Parser *in_stack_00000030;
  ExpressionSyntax *expr;
  Token openParen;
  Token iff;
  Token keyword;
  DisableIffSyntax *disable;
  TimingControlSyntax *timing;
  undefined1 in_stack_00000227;
  Parser *in_stack_00000228;
  Info *in_stack_ffffffffffffff18;
  DisableIffSyntax *in_stack_ffffffffffffff20;
  Parser *in_stack_ffffffffffffff28;
  ParserBase *in_stack_ffffffffffffff30;
  bitmask<slang::parsing::detail::ExpressionOptions> options;
  undefined8 in_stack_ffffffffffffff38;
  ParserBase *in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  undefined1 local_54 [2];
  TokenKind in_stack_ffffffffffffffae;
  ParserBase *in_stack_ffffffffffffffb0;
  Info *local_48;
  DisableIffSyntax *local_40;
  
  bVar1 = ParserBase::peek(in_stack_ffffffffffffff30,
                           (TokenKind)((ulong)in_stack_ffffffffffffff28 >> 0x30));
  local_40 = in_stack_ffffffffffffff20;
  if (bVar1) {
    parseTimingControl(in_stack_00000228,(bool)in_stack_00000227);
    local_40 = in_stack_ffffffffffffff20;
  }
  bVar1 = ParserBase::peek(in_stack_ffffffffffffff30,
                           (TokenKind)((ulong)in_stack_ffffffffffffff28 >> 0x30));
  if (bVar1) {
    ParserBase::consume(in_stack_ffffffffffffff40);
    options.m_bits = (underlying_type)((ulong)in_stack_ffffffffffffff30 >> 0x20);
    ParserBase::expect(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffae);
    TVar4 = ParserBase::expect(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffae);
    memset(local_54,0,4);
    bitmask<slang::parsing::detail::ExpressionOptions>::bitmask
              ((bitmask<slang::parsing::detail::ExpressionOptions> *)local_54);
    this_00 = (ParserBase *)parseExpressionOrDist(in_stack_ffffffffffffff28,options);
    pIVar2 = (Info *)(in_RDI + 0xe0);
    local_48 = TVar4._0_8_;
    local_40 = (DisableIffSyntax *)TVar4.info;
    in_stack_ffffffffffffff18 = local_48;
    TVar4 = ParserBase::expect(this_00,in_stack_ffffffffffffffae);
    in_stack_ffffffffffffff28 = TVar4._0_8_;
    in_stack_ffffffffffffff30 = (ParserBase *)TVar4.info;
    disable_00.info = pIVar2;
    disable_00.kind = (short)in_stack_ffffffffffffff48;
    disable_00._2_1_ = (char)((ulong)in_stack_ffffffffffffff48 >> 0x10);
    disable_00.numFlags.raw = (char)((ulong)in_stack_ffffffffffffff48 >> 0x18);
    disable_00.rawLen = (int)((ulong)in_stack_ffffffffffffff48 >> 0x20);
    iff_00.info = (Info *)in_stack_ffffffffffffff40;
    iff_00.kind = (short)in_stack_ffffffffffffff38;
    iff_00._2_1_ = (char)((ulong)in_stack_ffffffffffffff38 >> 0x10);
    iff_00.numFlags.raw = (char)((ulong)in_stack_ffffffffffffff38 >> 0x18);
    iff_00.rawLen = (int)((ulong)in_stack_ffffffffffffff38 >> 0x20);
    openParen_00.info = (Info *)in_stack_ffffffffffffff28;
    openParen_00.kind = (short)in_RDI;
    openParen_00._2_1_ = (char)((ulong)in_RDI >> 0x10);
    openParen_00.numFlags.raw = (char)((ulong)in_RDI >> 0x18);
    openParen_00.rawLen = (int)((ulong)in_RDI >> 0x20);
    closeParen.info = in_stack_ffffffffffffff18;
    closeParen._0_8_ = in_stack_ffffffffffffff30;
    slang::syntax::SyntaxFactory::disableIff
              ((SyntaxFactory *)in_stack_ffffffffffffff30,disable_00,iff_00,openParen_00,
               (ExpressionSyntax *)in_stack_ffffffffffffff28,closeParen);
  }
  parsePropertyExpr(in_stack_00000030,in_stack_0000002c);
  pPVar3 = slang::syntax::SyntaxFactory::propertySpec
                     ((SyntaxFactory *)in_stack_ffffffffffffff30,
                      (TimingControlSyntax *)in_stack_ffffffffffffff28,local_40,
                      (PropertyExprSyntax *)in_stack_ffffffffffffff18);
  return pPVar3;
}

Assistant:

PropertySpecSyntax& Parser::parsePropertySpec() {
    TimingControlSyntax* timing = nullptr;
    if (peek(TokenKind::At))
        timing = parseTimingControl(/* inAssertion */ true);

    DisableIffSyntax* disable = nullptr;
    if (peek(TokenKind::DisableKeyword)) {
        auto keyword = consume();
        auto iff = expect(TokenKind::IffKeyword);
        auto openParen = expect(TokenKind::OpenParenthesis);
        auto& expr = parseExpressionOrDist();
        disable = &factory.disableIff(keyword, iff, openParen, expr,
                                      expect(TokenKind::CloseParenthesis));
    }

    return factory.propertySpec(timing, disable, parsePropertyExpr(0));
}